

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  aiVector3D **__s;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t __n;
  VertexData *this_00;
  pointer pVVar3;
  element_type *peVar4;
  pointer ppBVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  VertexElement *element_3;
  aiMesh *paVar9;
  VertexData **ppVVar10;
  ulong *puVar11;
  aiFace *paVar12;
  aiVector3D *paVar13;
  MemoryStream *pMVar14;
  size_t sVar15;
  Logger *pLVar16;
  void *pvVar17;
  uint *puVar18;
  aiBone **ppaVar19;
  pointer ppBVar20;
  mapped_type *boneWeights;
  aiBone *paVar21;
  _Base_ptr p_Var22;
  runtime_error *prVar23;
  iterator __end2;
  aiFace *paVar24;
  Type type;
  Type type_00;
  VertexElement *element;
  size_t ii;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  Bone *pBVar28;
  pointer pVVar29;
  pointer pVVar30;
  pointer pVVar31;
  pointer pVVar32;
  long lVar33;
  Bone *this_01;
  size_t v;
  long lVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> referencedBones;
  uint16_t iout;
  MemoryStream *local_2d0;
  MemoryStream *local_2c8;
  aiVector3D *local_2b0;
  aiVector3D *local_2a8;
  MemoryStream *local_2a0;
  size_t local_280;
  ulong local_278;
  size_t local_270;
  ulong local_268;
  size_t local_258;
  ulong local_250;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_230;
  string local_200;
  pointer local_1e0;
  pointer local_1d8;
  long local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  size_t local_1b8;
  pointer local_1b0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only mesh operation type OT_TRIANGLE_LIST is supported. Found "
               ,0x3e);
    std::ostream::operator<<(local_1a8,(this->super_ISubMesh).operationType);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar23,(string *)&local_230);
    *(undefined ***)prVar23 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar9 = (aiMesh *)operator_new(0x520);
  paVar9->mPrimitiveTypes = 0;
  paVar9->mNumVertices = 0;
  paVar9->mNumFaces = 0;
  __s = &paVar9->mVertices;
  memset(__s,0,0xcc);
  paVar9->mBones = (aiBone **)0x0;
  paVar9->mMaterialIndex = 0;
  (paVar9->mName).length = 0;
  (paVar9->mName).data[0] = '\0';
  memset((paVar9->mName).data + 1,0x1b,0x3ff);
  paVar9->mNumAnimMeshes = 0;
  paVar9->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar9->mMethod = 0;
  (paVar9->mAABB).mMin.x = 0.0;
  (paVar9->mAABB).mMin.y = 0.0;
  (paVar9->mAABB).mMin.z = 0.0;
  (paVar9->mAABB).mMax.x = 0.0;
  (paVar9->mAABB).mMax.y = 0.0;
  (paVar9->mAABB).mMax.z = 0.0;
  paVar9->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar9->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar9->mNumUVComponents[0] = 0;
  paVar9->mNumUVComponents[1] = 0;
  paVar9->mNumUVComponents[2] = 0;
  paVar9->mNumUVComponents[3] = 0;
  paVar9->mNumUVComponents[4] = 0;
  paVar9->mNumUVComponents[5] = 0;
  paVar9->mNumUVComponents[6] = 0;
  paVar9->mNumUVComponents[7] = 0;
  paVar9->mColors[0] = (aiColor4D *)0x0;
  paVar9->mColors[1] = (aiColor4D *)0x0;
  paVar9->mColors[2] = (aiColor4D *)0x0;
  paVar9->mColors[3] = (aiColor4D *)0x0;
  paVar9->mColors[4] = (aiColor4D *)0x0;
  paVar9->mColors[5] = (aiColor4D *)0x0;
  paVar9->mColors[6] = (aiColor4D *)0x0;
  paVar9->mColors[7] = (aiColor4D *)0x0;
  paVar9->mPrimitiveTypes = 4;
  __n = (this->super_ISubMesh).name._M_string_length;
  if (0xfffffffffffffc00 < __n - 0x400) {
    (paVar9->mName).length = (ai_uint32)__n;
    memcpy((paVar9->mName).data,(this->super_ISubMesh).name._M_dataplus._M_p,__n);
    (paVar9->mName).data[__n] = '\0';
  }
  uVar2 = (this->super_ISubMesh).materialIndex;
  if (uVar2 != 0xffffffff) {
    paVar9->mMaterialIndex = uVar2;
  }
  ppVVar10 = &this->vertexData;
  if ((this->super_ISubMesh).usesSharedVertexData != false) {
    ppVVar10 = &parent->sharedVertexData;
  }
  this_00 = *ppVVar10;
  pVVar3 = (this_00->vertexElements).
           super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar29 = (this_00->vertexElements).
            super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pVVar32 = pVVar29; pVVar30 = pVVar29, pVVar32 != pVVar3; pVVar32 = pVVar32 + 1) {
    if (pVVar32->index == 0 && pVVar32->semantic == VES_POSITION) goto joined_r0x00466231;
  }
  pVVar32 = (pointer)0x0;
joined_r0x00466231:
  do {
    pVVar31 = pVVar29;
    if (pVVar30 == pVVar3) break;
    if (pVVar30->index == 0 && pVVar30->semantic == VES_NORMAL) goto joined_r0x0046625e;
    pVVar30 = pVVar30 + 1;
  } while( true );
  pVVar30 = (pointer)0x0;
joined_r0x0046625e:
  do {
    if (pVVar31 == pVVar3) break;
    if (pVVar31->index == 0 && pVVar31->semantic == VES_TEXTURE_COORDINATES)
    goto joined_r0x0046628b;
    pVVar31 = pVVar31 + 1;
  } while( true );
  pVVar31 = (pointer)0x0;
joined_r0x0046628b:
  do {
    if (pVVar29 == pVVar3) {
      pVVar29 = (pointer)0x0;
LAB_004662b0:
      if (pVVar32 == (pointer)0x0) {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
                   ,"");
        std::runtime_error::runtime_error(prVar23,(string *)local_1a8);
        *(undefined ***)prVar23 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pVVar32->type != VET_FLOAT3) {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
                   ,"");
        std::runtime_error::runtime_error(prVar23,(string *)local_1a8);
        *(undefined ***)prVar23 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pVVar30 != (pointer)0x0) && (pVVar30->type != VET_FLOAT3)) {
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,
                   "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
                   ,"");
        std::runtime_error::runtime_error(prVar23,(string *)local_1a8);
        *(undefined ***)prVar23 = &PTR__runtime_error_00900168;
        __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = this->indexData->faceCount;
      paVar9->mNumFaces = uVar2;
      uVar26 = (ulong)uVar2;
      puVar11 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
      *puVar11 = uVar26;
      paVar12 = (aiFace *)(puVar11 + 1);
      if (uVar2 != 0) {
        paVar24 = paVar12;
        do {
          paVar24->mNumIndices = 0;
          paVar24->mIndices = (uint *)0x0;
          paVar24 = paVar24 + 1;
        } while (paVar24 != paVar12 + uVar26);
      }
      paVar9->mFaces = paVar12;
      uVar2 = uVar2 * 3;
      paVar9->mNumVertices = uVar2;
      paVar13 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
      if (uVar26 != 0) {
        memset(paVar13,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *__s = paVar13;
      pMVar14 = VertexData::VertexBuffer(this_00,pVVar32->source);
      if (pVVar30 == (pointer)0x0) {
        local_2a0 = (MemoryStream *)0x0;
      }
      else {
        local_2a0 = VertexData::VertexBuffer(this_00,pVVar30->source);
      }
      if (pVVar31 == (pointer)0x0) {
        local_2c8 = (MemoryStream *)0x0;
      }
      else {
        local_2c8 = VertexData::VertexBuffer(this_00,pVVar31->source);
      }
      if (pVVar29 == (pointer)0x0) {
        local_2d0 = (MemoryStream *)0x0;
      }
      else {
        local_2d0 = VertexData::VertexBuffer(this_00,pVVar29->source);
      }
      local_1b8 = VertexElement::TypeSize(pVVar32->type);
      if (pVVar30 == (pointer)0x0) {
        local_258 = 0;
      }
      else {
        local_258 = VertexElement::TypeSize(pVVar30->type);
      }
      if (pVVar31 == (pointer)0x0) {
        local_270 = 0;
      }
      else {
        local_270 = VertexElement::TypeSize(pVVar31->type);
      }
      if (pVVar29 == (pointer)0x0) {
        local_280 = 0;
      }
      else {
        local_280 = VertexElement::TypeSize(pVVar29->type);
      }
      uVar7 = VertexData::VertexSize(this_00,pVVar32->source);
      if (pVVar30 == (pointer)0x0) {
        local_250 = 0;
      }
      else {
        uVar8 = VertexData::VertexSize(this_00,pVVar30->source);
        local_250 = (ulong)uVar8;
      }
      if (pVVar31 == (pointer)0x0) {
        local_268 = 0;
      }
      else {
        uVar8 = VertexData::VertexSize(this_00,pVVar31->source);
        local_268 = (ulong)uVar8;
      }
      if (pVVar29 == (pointer)0x0) {
        local_278 = 0;
      }
      else {
        uVar8 = VertexData::VertexSize(this_00,pVVar29->source);
        local_278 = (ulong)uVar8;
      }
      local_1d8 = (this_00->super_IVertexData).boneAssignments.
                  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_1e0 = (this_00->super_IVertexData).boneAssignments.
                  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2a0 != (MemoryStream *)0x0) {
        uVar2 = paVar9->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar13,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar9->mNormals = paVar13;
      }
      local_1b0 = pVVar32;
      if (local_2c8 == (MemoryStream *)0x0) {
        local_2c8 = (MemoryStream *)0x0;
      }
      else if (pVVar31->type - VET_FLOAT2 < 2) {
        sVar15 = VertexElement::ComponentCount(pVVar31->type);
        paVar9->mNumUVComponents[0] = (uint)sVar15;
        uVar2 = paVar9->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar13,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar9->mTextureCoords[0] = paVar13;
      }
      else {
        pLVar16 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
        VertexElement::TypeToString_abi_cxx11_
                  (&local_200,(VertexElement *)(ulong)pVVar31->type,type);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar16,(char *)local_230._M_impl._0_8_);
        if ((_Base_ptr *)local_230._M_impl._0_8_ !=
            &local_230._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_230._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_2c8 = (MemoryStream *)0x0;
      }
      if (local_2d0 == (MemoryStream *)0x0) {
        local_2d0 = (MemoryStream *)0x0;
      }
      else if (pVVar29->type - VET_FLOAT2 < 2) {
        sVar15 = VertexElement::ComponentCount(pVVar29->type);
        paVar9->mNumUVComponents[1] = (uint)sVar15;
        uVar2 = paVar9->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
        if (uVar2 != 0) {
          memset(paVar13,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar9->mTextureCoords[1] = paVar13;
      }
      else {
        pLVar16 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Ogre imported UV0 type ",0x17);
        VertexElement::TypeToString_abi_cxx11_
                  (&local_200,(VertexElement *)(ulong)pVVar29->type,type_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," is not compatible with Assimp. Ignoring UV.",0x2c);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar16,(char *)local_230._M_impl._0_8_);
        if ((_Base_ptr *)local_230._M_impl._0_8_ !=
            &local_230._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_230._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_2d0 = (MemoryStream *)0x0;
      }
      if (local_2c8 == (MemoryStream *)0x0) {
        local_2a8 = (aiVector3D *)0x0;
      }
      else {
        local_2a8 = paVar9->mTextureCoords[0];
      }
      if (local_2d0 == (MemoryStream *)0x0) {
        local_2b0 = (aiVector3D *)0x0;
      }
      else {
        local_2b0 = paVar9->mTextureCoords[1];
      }
      bVar36 = this->indexData->is32bit;
      local_1d0 = 6;
      if (bVar36 != false) {
        local_1d0 = 0xc;
      }
      if (paVar9->mNumFaces != 0) {
        local_1c0 = (ulong)uVar7;
        peVar4 = (this->indexData->buffer).
                 super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar27 = (ulong)bVar36 * 2 + 2;
        bVar36 = local_2a8 != (aiVector3D *)0x0;
        bVar37 = local_2b0 != (aiVector3D *)0x0;
        lVar35 = 0;
        iVar6 = 0;
        uVar26 = 0;
        do {
          pvVar17 = operator_new__(0xc);
          (*(peVar4->super_IOStream)._vptr_IOStream[4])(peVar4,uVar26 * local_1d0,0);
          if (this->indexData->is32bit == true) {
            (*(peVar4->super_IOStream)._vptr_IOStream[2])(peVar4,pvVar17,lVar27,3);
          }
          else {
            local_1a8[0]._M_impl._0_8_ = local_1a8[0]._M_impl._0_8_ & 0xffffffffffff0000;
            lVar33 = 0;
            do {
              (*(peVar4->super_IOStream)._vptr_IOStream[2])(peVar4,local_1a8,lVar27,1);
              *(uint *)((long)pvVar17 + lVar33 * 4) = (uint)(ushort)local_1a8[0]._M_impl._0_2_;
              lVar33 = lVar33 + 1;
            } while (lVar33 != 3);
          }
          paVar12 = paVar9->mFaces;
          paVar12[uVar26].mNumIndices = 3;
          local_1c8 = uVar26;
          puVar18 = (uint *)operator_new__(0xc);
          paVar12[uVar26].mIndices = puVar18;
          lVar33 = 0;
          lVar34 = 0;
          do {
            uVar7 = iVar6 + (int)lVar34;
            paVar12[uVar26].mIndices[lVar34] = uVar7;
            uVar2 = *(uint *)((long)pvVar17 + lVar34 * 4);
            uVar25 = (ulong)uVar2;
            IVertexData::AddVertexMapping(&this_00->super_IVertexData,uVar2,uVar7);
            (*(pMVar14->super_IOStream)._vptr_IOStream[4])
                      (pMVar14,(ulong)local_1b0->offset + uVar25 * local_1c0,0);
            (*(pMVar14->super_IOStream)._vptr_IOStream[2])
                      (pMVar14,(long)&(*__s)->x + lVar33 + lVar35,local_1b8,1);
            if (local_2a0 != (MemoryStream *)0x0) {
              (*(local_2a0->super_IOStream)._vptr_IOStream[4])
                        (local_2a0,(ulong)pVVar30->offset + local_250 * uVar25,0);
              (*(local_2a0->super_IOStream)._vptr_IOStream[2])
                        (local_2a0,(long)&paVar9->mNormals->x + lVar33 + lVar35,local_258,1);
            }
            if (bVar36 && local_2c8 != (MemoryStream *)0x0) {
              (*(local_2c8->super_IOStream)._vptr_IOStream[4])
                        (local_2c8,(ulong)pVVar31->offset + local_268 * uVar25,0);
              (*(local_2c8->super_IOStream)._vptr_IOStream[2])
                        (local_2c8,(long)&local_2a8->x + lVar33,local_270,1);
              *(float *)((long)&local_2a8->y + lVar33) =
                   1.0 - *(float *)((long)&local_2a8->y + lVar33);
            }
            if (bVar37 && local_2d0 != (MemoryStream *)0x0) {
              (*(local_2d0->super_IOStream)._vptr_IOStream[4])
                        (local_2d0,(ulong)pVVar29->offset + uVar25 * local_278,0);
              (*(local_2d0->super_IOStream)._vptr_IOStream[2])
                        (local_2d0,(long)&local_2b0->x + lVar33,local_280,1);
              *(float *)((long)&local_2b0->y + lVar33) =
                   1.0 - *(float *)((long)&local_2b0->y + lVar33);
            }
            lVar34 = lVar34 + 1;
            lVar33 = lVar33 + 0xc;
          } while (lVar33 != 0x24);
          operator_delete__(pvVar17);
          uVar26 = local_1c8 + 1;
          iVar6 = iVar6 + 3;
          lVar35 = lVar35 + 0x24;
          local_2a8 = local_2a8 + 3;
          local_2b0 = local_2b0 + 3;
        } while (uVar26 < paVar9->mNumFaces);
      }
      if ((local_1d8 != local_1e0) && (parent->skeleton != (Skeleton *)0x0)) {
        IVertexData::AssimpBoneWeights
                  ((AssimpVertexBoneWeightList *)local_1a8,&this_00->super_IVertexData,
                   (ulong)paVar9->mNumVertices);
        IVertexData::ReferencedBonesByWeights
                  ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)&local_230,&this_00->super_IVertexData);
        paVar9->mNumBones = (uint)local_230._M_impl.super__Rb_tree_header._M_node_count;
        ppaVar19 = (aiBone **)
                   operator_new__((local_230._M_impl.super__Rb_tree_header._M_node_count &
                                  0xffffffff) << 3);
        paVar9->mBones = ppaVar19;
        p_Var1 = &local_230._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_230._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
        {
          lVar27 = 0;
          p_Var22 = local_230._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            ppBVar20 = (parent->skeleton->bones).
                       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppBVar5 = (parent->skeleton->bones).
                      super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppBVar20 != ppBVar5) {
              do {
                this_01 = *ppBVar20;
                if (this_01->id == (short)p_Var22[1]._M_color) goto LAB_00466d3c;
                ppBVar20 = ppBVar20 + 1;
              } while (ppBVar20 != ppBVar5);
            }
            this_01 = (Bone *)0x0;
LAB_00466d3c:
            pBVar28 = this_01;
            boneWeights = std::
                          map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                          ::operator[]((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                        *)local_1a8,&this_01->id);
            paVar21 = Bone::ConvertToAssimpBone(this_01,(Skeleton *)pBVar28,boneWeights);
            ppaVar19[lVar27] = paVar21;
            p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
            lVar27 = lVar27 + 1;
          } while ((_Rb_tree_header *)p_Var22 != p_Var1);
        }
        std::
        _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
        ::~_Rb_tree(&local_230);
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
        ::~_Rb_tree(local_1a8);
      }
      return paVar9;
    }
    if (pVVar29->index == 1 && pVVar29->semantic == VES_TEXTURE_COORDINATES) goto LAB_004662b0;
    pVVar29 = pVVar29 + 1;
  } while( true );
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}